

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereUsablePartialIndex(int iTab,u8 jointype,WhereClause *pWC,Expr *pWhere)

{
  Expr *pE1;
  int iVar1;
  int iVar2;
  WhereClause *in_RCX;
  undefined8 *in_RDX;
  byte in_SIL;
  int in_EDI;
  Expr *pExpr;
  Parse *pParse;
  WhereTerm *pTerm;
  int i;
  Expr *in_stack_ffffffffffffffb8;
  Parse *pParse_00;
  undefined8 *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  int in_stack_fffffffffffffff0;
  
  uVar3 = 0xaaaaaaaa;
  if ((in_SIL & 0x40) == 0) {
    pParse_00 = *(Parse **)*in_RDX;
    for (; *(char *)&in_RCX->pWInfo == ','; in_RCX = *(WhereClause **)&in_RCX->nSlot) {
      iVar1 = whereUsablePartialIndex
                        (in_stack_fffffffffffffff0,(u8)((ulong)in_RDX >> 0x38),in_RCX,
                         (Expr *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
      if (iVar1 == 0) {
        return 0;
      }
    }
    local_30 = (undefined8 *)in_RDX[4];
    for (iVar1 = 0; iVar1 < *(int *)((long)in_RDX + 0x14); iVar1 = iVar1 + 1) {
      pE1 = (Expr *)*local_30;
      if (((((pE1->flags & 1) == 0) || ((pE1->w).iJoin == in_EDI)) &&
          (((in_SIL & 0x20) == 0 || ((pE1->flags & 1) != 0)))) &&
         ((iVar2 = sqlite3ExprImpliesExpr(pParse_00,pE1,in_stack_ffffffffffffffb8,0), iVar2 != 0 &&
          ((*(ushort *)((long)local_30 + 0x12) & 0x80) == 0)))) {
        return 1;
      }
      local_30 = local_30 + 7;
    }
  }
  return 0;
}

Assistant:

static int whereUsablePartialIndex(
  int iTab,             /* The table for which we want an index */
  u8 jointype,          /* The JT_* flags on the join */
  WhereClause *pWC,     /* The WHERE clause of the query */
  Expr *pWhere          /* The WHERE clause from the partial index */
){
  int i;
  WhereTerm *pTerm;
  Parse *pParse;

  if( jointype & JT_LTORJ ) return 0;
  pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_OuterON) || pExpr->w.iJoin==iTab)
     && ((jointype & JT_OUTER)==0 || ExprHasProperty(pExpr, EP_OuterON))
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab)
     && (pTerm->wtFlags & TERM_VNULL)==0
    ){
      return 1;
    }
  }
  return 0;
}